

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O3

bool __thiscall tl::StrT<char>::operator==(StrT<char> *this,CStrT<char> o)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  
  uVar1 = o._size;
  if (this->_size != uVar1) {
    return false;
  }
  if (uVar1 != 0) {
    lVar2 = 0;
    do {
      bVar3 = o._str[lVar2] == this->_str[lVar2];
      if (!bVar3) {
        return bVar3;
      }
      bVar4 = (ulong)uVar1 - 1 != lVar2;
      lVar2 = lVar2 + 1;
    } while (bVar4);
    return bVar3;
  }
  return true;
}

Assistant:

bool StrT<CharT>::operator==(CStrT<CharT> o)const
{
    if(_size != o.size())
        return false;
    for(uint32_t i = 0; i < _size; i++) {
        if(o[i] != _str[i])
            return false;
    }
    return true;
}